

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int base64_decode(uchar *input,uchar *output)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  int c4;
  int c3;
  int c2;
  int c1;
  int len;
  uchar *output_local;
  uchar *input_local;
  
  len = 0;
  output_local = output;
  input_local = input;
  if (output == (uchar *)0x0) {
    output_local = input;
  }
  while( true ) {
    if (*input_local == '\0') {
      return len;
    }
    bVar1 = *input_local;
    if (char_to_num[(int)(uint)bVar1] == -1) {
      return -1;
    }
    uVar2 = (uint)input_local[1];
    if (char_to_num[(int)uVar2] == -1) {
      return -1;
    }
    pbVar5 = input_local + 3;
    uVar3 = (uint)input_local[2];
    if ((uVar3 != 0x3d) && (char_to_num[(int)uVar3] == -1)) break;
    input_local = input_local + 4;
    uVar4 = (uint)*pbVar5;
    if ((uVar4 != 0x3d) && (char_to_num[(int)uVar4] == -1)) {
      return -1;
    }
    *output_local = char_to_num[(int)(uint)bVar1] << 2 | char_to_num[(int)uVar2] >> 4;
    if (uVar3 == 0x3d) {
      return len + 1;
    }
    pbVar5 = output_local + 2;
    output_local[1] = char_to_num[(int)uVar2] << 4 | char_to_num[(int)uVar3] >> 2;
    if (uVar4 == 0x3d) {
      return len + 2;
    }
    output_local = output_local + 3;
    *pbVar5 = char_to_num[(int)uVar3] << 6 | char_to_num[(int)uVar4];
    len = len + 3;
  }
  return -1;
}

Assistant:

static int 
base64_decode(unsigned char *input, unsigned char *output)
{
    int len = 0;
    int c1, c2, c3, c4;

    if (output == NULL) output = input;
    while (*input) {
	c1 = *input++;
	if (char_to_num[c1] == -1) return -1;
	c2 = *input++;
	if (char_to_num[c2] == -1) return -1;
	c3 = *input++;
	if (c3 != '=' && char_to_num[c3] == -1) return -1; 
	c4 = *input++;
	if (c4 != '=' && char_to_num[c4] == -1) return -1;
	*output++ = (char_to_num[c1] << 2) | (char_to_num[c2] >> 4);
	++len;
	if (c3 == '=') break;
	*output++ = ((char_to_num[c2] << 4) & 0xf0) | (char_to_num[c3] >> 2);
	++len;
	if (c4 == '=') break;
	*output++ = ((char_to_num[c3] << 6) & 0xc0) | char_to_num[c4];
	++len;
    }

    return len;
}